

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O0

void __thiscall asl::Date::Date(Date *this,String *t)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  Map<asl::String,_int> *pMVar11;
  String *pSVar12;
  int *piVar13;
  double dVar14;
  __type _Var15;
  int local_304;
  int local_21c;
  int n;
  int i;
  double ms;
  int local_208;
  int tz;
  int s;
  int mi;
  int h;
  bool hassecs;
  bool local;
  bool basic;
  int iTime;
  int d;
  int m;
  int y;
  char *p;
  int s_1;
  int m_1;
  int h_1;
  char *time;
  int y_1;
  int d_1;
  int local_1b4;
  int mo;
  int local_194;
  String local_190;
  int local_174;
  String local_170;
  int local_154;
  String local_150;
  int local_134;
  String local_130;
  int local_114;
  String local_110;
  int local_f4;
  String local_f0;
  int local_d4;
  String local_d0;
  int local_b4;
  String local_b0;
  int local_94;
  String local_90;
  int local_74;
  String local_70;
  int local_54;
  String local_50;
  Map<asl::String,_int> local_38;
  undefined4 local_30;
  undefined1 local_20 [8];
  Array<asl::String> parts;
  String *t_local;
  Date *this_local;
  
  parts._a = t;
  dVar14 = nan((char *)this);
  this->_t = (double)SUB84(dVar14,0);
  pcVar10 = asl::String::operator[](parts._a,0);
  if ((*pcVar10 < 'B') || (pcVar10 = asl::String::operator[](parts._a,0), 'Y' < *pcVar10)) {
    _m = asl::String::data(parts._a);
    bVar4 = true;
    bVar2 = 0;
    bVar1 = false;
    iVar5 = asl::String::length(parts._a);
    if ((iVar5 < 10) || ((_m[4] != '-' || (_m[7] != '-')))) {
      iVar5 = asl::String::length(parts._a);
      if (iVar5 < 8) {
        return;
      }
    }
    else {
      bVar4 = false;
    }
    iVar5 = parseInt(_m,4);
    iVar6 = 5;
    if (bVar4) {
      iVar6 = 4;
    }
    iVar6 = parseInt(_m + iVar6,2);
    iVar7 = 8;
    if (bVar4) {
      iVar7 = 6;
    }
    iVar7 = parseInt(_m + iVar7,2);
    if (((bVar4) && (iVar8 = asl::String::length(parts._a), 0xc < iVar8)) &&
       (pcVar10 = asl::String::operator[](parts._a,8), *pcVar10 == 'T')) {
      h = 9;
    }
    else {
      if (bVar4) {
        return;
      }
      iVar8 = asl::String::length(parts._a);
      if (iVar8 < 0x10) {
        return;
      }
      pcVar10 = asl::String::operator[](parts._a,10);
      if (*pcVar10 != 'T') {
        return;
      }
      h = 0xb;
    }
    if (((-1 < iVar5) && (-1 < iVar6)) && (-1 < iVar7)) {
      s = 0;
      tz = 0;
      local_208 = 0;
      ms._4_4_ = 0;
      _n = 0.0;
      if (h != 0) {
        _m = _m + h;
        iVar8 = asl::String::length(parts._a);
        iVar9 = 5;
        if (bVar4) {
          iVar9 = 4;
        }
        if (iVar9 <= iVar8 - h) {
          if (bVar4) {
            iVar8 = asl::String::length(parts._a);
            if ((5 < iVar8 - h) && (bVar3 = myisdigit(_m[4]), bVar3)) {
              bVar1 = true;
            }
          }
          else {
            if (_m[2] != ':') {
              return;
            }
            iVar8 = asl::String::length(parts._a);
            if ((7 < iVar8 - h) && (_m[5] == ':')) {
              bVar1 = true;
            }
          }
          s = parseInt(_m,2);
          iVar8 = 3;
          if (bVar4) {
            iVar8 = 2;
          }
          tz = parseInt(_m + iVar8,2);
          iVar8 = 6;
          if (bVar4) {
            iVar8 = 4;
          }
          iVar9 = 0;
          if (bVar1) {
            iVar9 = 2;
          }
          local_208 = parseInt(_m + iVar8,iVar9);
          if (bVar1) {
            local_304 = 8;
            if (bVar4) {
              local_304 = 6;
            }
          }
          else {
            local_304 = 5;
            if (bVar4) {
              local_304 = 4;
            }
          }
          _m = _m + local_304;
          if (*_m == '.') {
            local_21c = 1;
            while (bVar4 = myisdigit(_m[local_21c]), bVar4) {
              local_21c = local_21c + 1;
            }
            iVar8 = parseInt(_m + 1,local_21c + -1);
            _Var15 = std::pow<double,int>(10.0,1 - local_21c);
            _n = (double)iVar8 * _Var15;
            _m = _m + local_21c;
          }
          if (s < 0) {
            return;
          }
          if (0x17 < s) {
            return;
          }
          if (tz < 0) {
            return;
          }
          if (0x3b < tz) {
            return;
          }
          if (local_208 < 0) {
            return;
          }
          if (0x3b < local_208) {
            return;
          }
          if (_n < 0.0) {
            return;
          }
          if (*_m == 'Z') {
            ms._4_4_ = 0;
          }
          else if ((*_m == '+') || (*_m == '-')) {
            pcVar10 = asl::String::data(parts._a);
            iVar8 = asl::String::length(parts._a);
            iVar8 = ((int)pcVar10 + iVar8) - (int)_m;
            if (2 < iVar8) {
              iVar9 = parseInt(_m + 1,2);
              ms._4_4_ = iVar9 * 0x3c;
            }
            if ((iVar8 == 6) && (_m[3] == ':')) {
              iVar8 = parseInt(_m + 4,2);
              ms._4_4_ = iVar8 + ms._4_4_;
            }
            else if (iVar8 == 5) {
              iVar8 = parseInt(_m + 3,2);
              ms._4_4_ = iVar8 + ms._4_4_;
            }
            else if (iVar8 != 3) {
              ms._4_4_ = -1000000;
            }
            if (ms._4_4_ < -100000) {
              return;
            }
            if (*_m == '+') {
              ms._4_4_ = -ms._4_4_;
            }
          }
          else {
            if (*_m != '\0') {
              return;
            }
            bVar2 = 1;
          }
        }
      }
      construct(this,(uint)bVar2,iVar5,iVar6,iVar7,s,tz,local_208);
      this->_t = (double)(ms._4_4_ * 0x3c) + _n + this->_t;
    }
  }
  else {
    asl::String::split((String *)local_20);
    iVar5 = Array<asl::String>::length((Array<asl::String> *)local_20);
    if (5 < iVar5) {
      if ((Date(asl::String_const&)::months == '\0') &&
         (iVar5 = __cxa_guard_acquire(&Date(asl::String_const&)::months), iVar5 != 0)) {
        asl::String::String(&local_50,"Jan");
        local_54 = 1;
        Map<asl::String,_int>::Map(&local_38,&local_50,&local_54);
        asl::String::String(&local_70,"Feb");
        local_74 = 2;
        pMVar11 = Map<asl::String,_int>::operator()(&local_38,&local_70,&local_74);
        asl::String::String(&local_90,"Mar");
        local_94 = 3;
        pMVar11 = Map<asl::String,_int>::operator()(pMVar11,&local_90,&local_94);
        asl::String::String(&local_b0,"Apr");
        local_b4 = 4;
        pMVar11 = Map<asl::String,_int>::operator()(pMVar11,&local_b0,&local_b4);
        asl::String::String(&local_d0,"May");
        local_d4 = 5;
        pMVar11 = Map<asl::String,_int>::operator()(pMVar11,&local_d0,&local_d4);
        asl::String::String(&local_f0,"Jun");
        local_f4 = 6;
        pMVar11 = Map<asl::String,_int>::operator()(pMVar11,&local_f0,&local_f4);
        asl::String::String(&local_110,"Jul");
        local_114 = 7;
        pMVar11 = Map<asl::String,_int>::operator()(pMVar11,&local_110,&local_114);
        asl::String::String(&local_130,"Aug");
        local_134 = 8;
        pMVar11 = Map<asl::String,_int>::operator()(pMVar11,&local_130,&local_134);
        asl::String::String(&local_150,"Sep");
        local_154 = 9;
        pMVar11 = Map<asl::String,_int>::operator()(pMVar11,&local_150,&local_154);
        asl::String::String(&local_170,"Oct");
        local_174 = 10;
        pMVar11 = Map<asl::String,_int>::operator()(pMVar11,&local_170,&local_174);
        asl::String::String(&local_190,"Nov");
        local_194 = 0xb;
        pMVar11 = Map<asl::String,_int>::operator()(pMVar11,&local_190,&local_194);
        asl::String::String((String *)&mo,"Dec");
        local_1b4 = 0xc;
        pMVar11 = Map<asl::String,_int>::operator()(pMVar11,(String *)&mo,&local_1b4);
        Map<asl::String,_int>::Map(&Date::months,pMVar11);
        asl::String::~String((String *)&mo);
        asl::String::~String(&local_190);
        asl::String::~String(&local_170);
        asl::String::~String(&local_150);
        asl::String::~String(&local_130);
        asl::String::~String(&local_110);
        asl::String::~String(&local_f0);
        asl::String::~String(&local_d0);
        asl::String::~String(&local_b0);
        asl::String::~String(&local_90);
        asl::String::~String(&local_70);
        Map<asl::String,_int>::~Map(&local_38);
        asl::String::~String(&local_50);
        __cxa_atexit(Map<asl::String,_int>::~Map,&Date::months,&__dso_handle);
        __cxa_guard_release(&Date(asl::String_const&)::months);
      }
      pSVar12 = Array<asl::String>::operator[]((Array<asl::String> *)local_20,2);
      y_1 = 0;
      piVar13 = Map<asl::String,_int>::get(&Date::months,pSVar12,&y_1);
      d_1 = *piVar13;
      pSVar12 = Array<asl::String>::operator[]((Array<asl::String> *)local_20,1);
      pcVar10 = asl::String::operator_cast_to_char_(pSVar12);
      iVar5 = parseInt(pcVar10,2);
      pSVar12 = Array<asl::String>::operator[]((Array<asl::String> *)local_20,3);
      pcVar10 = asl::String::operator_cast_to_char_(pSVar12);
      pSVar12 = Array<asl::String>::operator[]((Array<asl::String> *)local_20,3);
      iVar6 = asl::String::length(pSVar12);
      iVar6 = parseInt(pcVar10,iVar6);
      if (((d_1 != 0) && (-1 < iVar6)) && (-1 < iVar5)) {
        pSVar12 = Array<asl::String>::operator[]((Array<asl::String> *)local_20,4);
        pcVar10 = asl::String::operator_cast_to_char_(pSVar12);
        pSVar12 = Array<asl::String>::operator[]((Array<asl::String> *)local_20,4);
        iVar7 = asl::String::length(pSVar12);
        if (((iVar7 == 8) && (pcVar10[2] == ':')) && (pcVar10[5] == ':')) {
          iVar7 = parseInt(pcVar10,2);
          iVar8 = parseInt(pcVar10 + 3,2);
          iVar9 = parseInt(pcVar10 + 6,2);
          construct(this,UTC,iVar6,d_1,iVar5,iVar7,iVar8,iVar9);
        }
      }
    }
    local_30 = 1;
    Array<asl::String>::~Array((Array<asl::String> *)local_20);
  }
  return;
}

Assistant:

Date::Date(const String& t)
{
	_t = nan();
	if (t[0] > 'A' && t[0] < 'Z') // HTTP like? "Thu, 18 May 2017 03:24:12 GMT"
	{
		Array<String> parts = t.split();
		if (parts.length() < 6)
			return;
		
		static Map<String, int> months = Map<String, int>("Jan", 1)("Feb", 2)(
		    "Mar", 3)("Apr", 4)("May", 5)("Jun", 6)("Jul", 7)("Aug", 8)("Sep", 9)("Oct", 10)("Nov", 11)("Dec", 12);
		
		int mo = months.get(parts[2], 0);
		int d = parseInt(parts[1], 2);
		int y = parseInt(parts[3], parts[3].length());
		if (mo == 0 || y < 0 || d < 0)
			return;
		const char* time = parts[4];
		if (parts[4].length() != 8 || time[2] != ':' || time[5] != ':')
			return;
		int h = parseInt(time, 2);
		int m = parseInt(time + 3, 2);
		int s = parseInt(time + 6, 2);
		construct(UTC, y, mo, d, h, m, s);
		return;
	}
	const char* p = t.data();
	int         y = -1, m = 1, d = 1;
	int         iTime = 0;
	bool        basic = true, local = false, hassecs = false;

	if (t.length() >= 10 && p[4] == '-' && p[7] == '-')
	{
		basic = false;
	}
	else if (t.length() < 8)
		return;

	y = parseInt(p + 0, 4);
	m = parseInt(p + (basic ? 4 : 5), 2);
	d = parseInt(p + (basic ? 6 : 8), 2);

	if (basic && t.length() > 12 && t[8] == 'T')
		iTime = 9;
	else if (!basic && t.length() > 15 && t[10] == 'T')
		iTime = 11;
	else
		return;

	if (y < 0 || m < 0 || d < 0)
		return;

	int    h = 0, mi = 0, s = 0, tz = 0;
	double ms = 0;

	if (iTime > 0)
		p = p + iTime;

	if (iTime > 0 && t.length() - iTime >= (basic ? 4 : 5)) // there is time
	{
		if (!basic) // ext
		{
			if (p[2] != ':')
				return;
			if (t.length() - iTime >= 8 && p[5] == ':')
				hassecs = true;
		}
		else // basic
		{
			if (t.length() - iTime >= 6 && myisdigit(p[4]))
				hassecs = true;
		}

		h = parseInt(p, 2);
		mi = parseInt(p + (basic ? 2 : 3), 2);
		s = parseInt(p + (basic ? 4 : 6), hassecs ? 2 : 0);
		p += hassecs ? (basic ? 6 : 8) : (basic ? 4 : 5);

		if (p[0] == '.') // have ms
		{
			int i = 1;
			while (myisdigit(p[i]))
				i++;
			ms = parseInt(p + 1, i - 1) * pow(10.0, 1-i);
			p += i;
		}

		if (h < 0 || h > 23 || mi < 0 || mi > 59 || s < 0 || s > 59 || ms < 0)
			return;

		if (p[0] == 'Z')
			tz = 0;
		else if (p[0] == '+' || p[0] == '-')
		{
			int n = int(t.data() + t.length() - p);
			if (n >= 3)
				tz = parseInt(p + 1, 2) * 60;
			if (n == 6 && p[3] == ':')
				tz += parseInt(p + 4, 2);
			else if (n == 5)
				tz += parseInt(p + 3, 2);
			else if (n != 3)
				tz = -1000000;

			if (tz < -100000)
				return;

			if (p[0] == '+')
				tz = -tz;
		}
		else if (p[0] == '\0')
			local = true;
		else
			return;
	}

	construct(local ? LOCAL : UTC, y, m, d, h, mi, s);

	_t += tz * 60 + ms;
}